

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_owhere(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  char cVar2;
  OBJ_DATA *pOVar3;
  bool bVar4;
  uint uVar5;
  BUFFER *buffer;
  OBJ_DATA *pOVar6;
  char *pcVar7;
  char cVar8;
  bool bVar9;
  char *__format;
  OBJ_DATA **obj;
  char buf [4608];
  char *local_1248;
  char local_1238 [4616];
  
  buffer = new_buf();
  if (*argument == '\0') {
    send_to_char("Find what?\n\r",ch);
    return;
  }
  obj = &object_list;
  bVar9 = false;
  uVar5 = 0;
LAB_002c9d8b:
  do {
    do {
      obj = &((OBJ_DATA *)obj)->next->next;
      if ((OBJ_DATA *)obj == (OBJ_DATA *)0x0) {
        if (!bVar9) {
          send_to_char("Nothing like that in heaven or earth.\n\r",ch);
          goto LAB_002c9f2b;
        }
        goto LAB_002c9ee7;
      }
      bVar4 = can_see_obj(ch,(OBJ_DATA *)obj);
    } while (((!bVar4) || (bVar4 = is_name(argument,((OBJ_DATA *)obj)->name), !bVar4)) ||
            (pOVar3 = (OBJ_DATA *)obj, ch->level < ((OBJ_DATA *)obj)->level));
    do {
      pOVar6 = pOVar3;
      pOVar3 = pOVar6->in_obj;
    } while (pOVar6->in_obj != (OBJ_DATA *)0x0);
    if (((pOVar6->carried_by == (CHAR_DATA *)0x0) ||
        (bVar4 = can_see(ch,pOVar6->carried_by), !bVar4)) ||
       (pOVar6->carried_by->in_room == (ROOM_INDEX_DATA *)0x0)) {
      if ((pOVar6->in_room == (ROOM_INDEX_DATA *)0x0) ||
         (bVar4 = can_see_room(ch,pOVar6->in_room), !bVar4)) goto LAB_002c9d8b;
      local_1248 = ((OBJ_DATA *)obj)->short_descr;
      pcVar7 = get_room_name(pOVar6->in_room);
      sVar1 = pOVar6->in_room->vnum;
      __format = "%3d) %s is in %s [Room %d]\n\r";
    }
    else {
      local_1248 = ((OBJ_DATA *)obj)->short_descr;
      pcVar7 = pers(pOVar6->carried_by,ch);
      sVar1 = pOVar6->carried_by->in_room->vnum;
      __format = "%3d) %s is carried by %s [Room %d]\n\r";
    }
    sprintf(local_1238,__format,(ulong)(uVar5 + 1),local_1248,pcVar7,(ulong)(uint)(int)sVar1);
    cVar2 = (char)local_1238._0_4_;
    cVar8 = cVar2 + -0x20;
    if (0x19 < (byte)(cVar2 + 0x9fU)) {
      cVar8 = cVar2;
    }
    local_1238[0] = cVar8;
    add_buf(buffer,local_1238);
    bVar9 = true;
    bVar4 = 0xc6 < uVar5;
    uVar5 = uVar5 + 1;
    if (bVar4) {
LAB_002c9ee7:
      pcVar7 = buf_string(buffer);
      page_to_char(pcVar7,ch);
LAB_002c9f2b:
      free_buf(buffer);
      return;
    }
  } while( true );
}

Assistant:

void do_owhere(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_INPUT_LENGTH];
	BUFFER *buffer;
	OBJ_DATA *obj;
	OBJ_DATA *in_obj;
	bool found;
	int number = 0, max_found;

	found = false;
	number = 0;
	max_found = 200;

	buffer = new_buf();

	if (argument[0] == '\0')
	{
		send_to_char("Find what?\n\r", ch);
		return;
	}

	for (obj = object_list; obj != nullptr; obj = obj->next)
	{
		if (!can_see_obj(ch, obj) || !is_name(argument, obj->name) || ch->level < obj->level)
			continue;

		number++;

		for (in_obj = obj; in_obj->in_obj != nullptr; in_obj = in_obj->in_obj)
			;

		if (in_obj->carried_by != nullptr && can_see(ch, in_obj->carried_by) && in_obj->carried_by->in_room != nullptr)
		{
			sprintf(buf, "%3d) %s is carried by %s [Room %d]\n\r",
				number, obj->short_descr,
				pers(in_obj->carried_by, ch),
				in_obj->carried_by->in_room->vnum);
		}
		else if (in_obj->in_room != nullptr && can_see_room(ch, in_obj->in_room))
		{
			sprintf(buf, "%3d) %s is in %s [Room %d]\n\r",
				number,
				obj->short_descr,
				get_room_name(in_obj->in_room),
				in_obj->in_room->vnum);
		}
		else
		{
			number--;
			continue;
		}

		found = true;

		buf[0] = UPPER(buf[0]);
		add_buf(buffer, buf);

		if (number >= max_found)
			break;
	}

	if (!found)
		send_to_char("Nothing like that in heaven or earth.\n\r", ch);
	else
		page_to_char(buf_string(buffer), ch);

	free_buf(buffer);
}